

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_timer.c
# Opt level: O3

double mfb_timer_now(mfb_timer *tmr)

{
  uint64_t uVar1;
  uint64_t uVar2;
  undefined1 auVar3 [16];
  
  if (tmr != (mfb_timer *)0x0) {
    uVar1 = mfb_timer_tick();
    uVar2 = (uVar1 - tmr->start_time) + tmr->time;
    tmr->time = uVar2;
    auVar3._8_4_ = (int)(uVar2 >> 0x20);
    auVar3._0_8_ = uVar2;
    auVar3._12_4_ = 0x45300000;
    tmr->start_time = uVar1;
    return ((auVar3._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * g_timer_resolution;
  }
  return 0.0;
}

Assistant:

double
mfb_timer_now(struct mfb_timer *tmr) {
    uint64_t    counter;

    if(tmr == 0x0)
        return 0.0;

    counter         = mfb_timer_tick();
    tmr->time      += (counter - tmr->start_time);
    tmr->start_time = counter;

    return tmr->time * g_timer_resolution;
}